

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

bool EV_OpenPolyDoor(line_t_conflict *line,int polyNum,double speed,DAngle *angle,int delay,
                    double distance,podoortype_t type)

{
  double dVar1;
  FPolyObj *poly;
  DPolyAction *pDVar2;
  DPolyDoor *this;
  bool bVar3;
  int local_200;
  TAngle<double> local_1e8;
  double dStack_1e0;
  FPolyMirrorIterator it;
  
  it.CurPoly = PO_GetPolyobj(polyNum);
  if (it.CurPoly == (FPolyObj *)0x0) {
    bVar3 = false;
    Printf("EV_OpenPolyDoor: Invalid polyobj num: %d\n",polyNum);
  }
  else {
    it.UsedPolys[0] = (it.CurPoly)->tag;
    it.NumUsedPolys = 1;
    bVar3 = false;
    local_200 = 1;
    while (poly = FPolyMirrorIterator::NextMirror(&it), poly != (FPolyObj *)0x0) {
      pDVar2 = GC::ReadBarrier<DPolyAction>((DPolyAction **)&poly->specialdata);
      if (pDVar2 != (DPolyAction *)0x0) {
        return bVar3;
      }
      if (poly->bBlocked != false) {
        return bVar3;
      }
      if ((type == PODOOR_SWING) && (poly->bHasPortals == '\x02')) {
        return bVar3;
      }
      this = (DPolyDoor *)DObject::operator_new(0x90);
      DPolyDoor::DPolyDoor(this,poly->tag,type);
      (poly->specialdata).field_0.p = (DPolyAction *)this;
      if (type == PODOOR_SLIDE) {
        this->m_WaitTics = delay;
        (this->super_DMovePoly).super_DPolyAction.m_Speed = speed;
        this->m_TotalDist = distance;
        (this->super_DMovePoly).super_DPolyAction.m_Dist = distance;
        (this->m_Direction).Degrees = angle->Degrees;
        TAngle<double>::ToVector(&local_1e8,speed);
        (this->super_DMovePoly).m_Speedv.X = local_1e8.Degrees;
        (this->super_DMovePoly).m_Speedv.Y = dStack_1e0;
        SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
        angle->Degrees = angle->Degrees + 180.0;
        bVar3 = true;
      }
      else {
        bVar3 = true;
        if (type == PODOOR_SWING) {
          this->m_WaitTics = delay;
          (this->m_Direction).Degrees = (double)local_200;
          (this->super_DMovePoly).super_DPolyAction.m_Speed =
               (double)local_200 * speed * 1.40625 * 0.125;
          dVar1 = angle->Degrees;
          this->m_TotalDist = dVar1;
          (this->super_DMovePoly).super_DPolyAction.m_Dist = dVar1;
          SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
          local_200 = -local_200;
          bVar3 = true;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool EV_OpenPolyDoor(line_t *line, int polyNum, double speed, DAngle angle, int delay, double distance, podoortype_t type)
{
	DPolyDoor *pd = NULL;
	FPolyObj *poly;
	int swingdir = 1;	// ADD:  PODOOR_SWINGL, PODOOR_SWINGR

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_OpenPolyDoor: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked))
		{ // poly is already moving
			break;
		}
		if (poly->bHasPortals == 2 && type == PODOOR_SWING)
		{
			// cannot do rotations on linked polyportals.
			break;
		}

		pd = new DPolyDoor(poly->tag, type);
		poly->specialdata = pd;
		if (type == PODOOR_SLIDE)
		{
			pd->m_WaitTics = delay;
			pd->m_Speed = speed;
			pd->m_Dist = pd->m_TotalDist = distance; // Distance
			pd->m_Direction = angle;
			pd->m_Speedv = angle.ToVector(speed);
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			angle += 180.;	// reverse the angle
		}
		else if (type == PODOOR_SWING)
		{
			pd->m_WaitTics = delay;
			pd->m_Direction.Degrees = swingdir; 
			pd->m_Speed = (speed*swingdir*(90. / 64)) / 8;
			pd->m_Dist = pd->m_TotalDist = angle.Degrees;
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			swingdir = -swingdir;	// reverse the direction
		}

	}
	return pd != NULL;	// Return true if something started moving.
}